

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O1

bool __thiscall
cmQtAutoGenerators::InputFilesNewerThanQrc
          (cmQtAutoGenerators *this,string *qrcFile,string *rccOutput)

{
  bool bVar1;
  mapped_type *pmVar2;
  string *f1;
  bool bVar3;
  int local_2c;
  
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::operator[](&this->RccInputs,qrcFile);
  f1 = (pmVar2->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  bVar3 = f1 != (pmVar2->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
  if (bVar3) {
    local_2c = 0;
    bVar1 = cmsys::SystemTools::FileTimeCompare(f1,rccOutput,&local_2c);
    if ((bVar1) && (local_2c < 0)) {
      while( true ) {
        f1 = f1 + 1;
        bVar1 = f1 == (pmVar2->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
        bVar3 = !bVar1;
        if (bVar1) break;
        local_2c = 0;
        bVar1 = cmsys::SystemTools::FileTimeCompare(f1,rccOutput,&local_2c);
        if (!bVar1) {
          return bVar3;
        }
        if (-1 < local_2c) {
          return bVar3;
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool cmQtAutoGenerators::InputFilesNewerThanQrc(const std::string& qrcFile,
                                                const std::string& rccOutput)
{
  std::vector<std::string> const& files = this->RccInputs[qrcFile];
  for (std::vector<std::string>::const_iterator it = files.begin();
       it != files.end(); ++it)
    {
    int inputNewerThanQrc = 0;
    bool success = cmsys::SystemTools::FileTimeCompare(*it,
                                                      rccOutput,
                                                      &inputNewerThanQrc);
    if (!success || inputNewerThanQrc >= 0)
      {
      return true;
      }
    }
  return false;
}